

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void __thiscall
crnlib::vector<unsigned_char>::vector(vector<unsigned_char> *this,vector<unsigned_char> *other)

{
  uint uVar1;
  
  this->m_p = (uchar *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  increase_capacity(this,other->m_size,false,false);
  uVar1 = other->m_size;
  this->m_size = uVar1;
  memcpy(this->m_p,other->m_p,(ulong)uVar1);
  return;
}

Assistant:

inline vector(const vector& other):
            m_p(nullptr),
            m_size(0),
            m_capacity(0)
        {
            increase_capacity(other.m_size, false);

            m_size = other.m_size;

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                memcpy(m_p, other.m_p, m_size * sizeof(T));
            }
            else
            {
                T* pDst = m_p;
                const T* pSrc = other.m_p;
                for (uint i = m_size; i > 0; i--)
                {
                    helpers::construct(pDst++, *pSrc++);
                }
            }
        }